

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

int __thiscall NaPetriNet::unlink(NaPetriNet *this,char *__name)

{
  int extraout_EAX;
  undefined4 *puVar1;
  NaPetriNode *pNVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  NaPetriConnector *in_RDX;
  
  if ((__name != (char *)0x0) && (in_RDX != (NaPetriConnector *)0x0)) {
    (**(code **)(*(long *)__name + 0x60))(__name,in_RDX);
    (*in_RDX->_vptr_NaPetriConnector[0xc])(in_RDX,__name);
    pNVar2 = NaPetriConnector::host((NaPetriConnector *)__name);
    pcVar3 = NaPetriNode::name(pNVar2);
    pcVar4 = NaPetriConnector::name((NaPetriConnector *)__name);
    pNVar2 = NaPetriConnector::host(in_RDX);
    pcVar5 = NaPetriNode::name(pNVar2);
    pcVar6 = NaPetriConnector::name(in_RDX);
    NaPrintLog("Unlink %s.%s & %s.%s\n",pcVar3,pcVar4,pcVar5,pcVar6);
    return extraout_EAX;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

void
NaPetriNet::unlink (NaPetriConnector* pcSrc, NaPetriConnector* pcDst)
{
    if(NULL == pcSrc || NULL == pcDst)
        throw(na_null_pointer);

    pcSrc->unlink(pcDst);
    pcDst->unlink(pcSrc);

    NaPrintLog("Unlink %s.%s & %s.%s\n",
               pcSrc->host()->name(), pcSrc->name(),
               pcDst->host()->name(), pcDst->name());
}